

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  uint uVar1;
  stbi__context *psVar2;
  bool bVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  stbi__uint32 sVar9;
  uint uVar10;
  stbi_uc *psVar11;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  stbi_uc *psVar19;
  uint uVar20;
  long lVar21;
  stbi_uc *psVar22;
  ulong uVar23;
  ulong uVar24;
  stbi_uc *psVar25;
  byte bVar26;
  byte *pbVar27;
  byte bVar28;
  ulong uVar29;
  byte *pbVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  ulong uVar40;
  int local_b8;
  ulong uVar12;
  
  psVar2 = a->s;
  uVar7 = x * out_n;
  uVar1 = psVar2->img_n;
  psVar11 = (stbi_uc *)malloc((ulong)(uVar7 * y));
  a->out = psVar11;
  if (psVar11 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar8 = uVar1 * x;
    sVar9 = iVar8 * depth + 7U >> 3;
    uVar12 = (ulong)sVar9;
    uVar10 = (sVar9 + 1) * y;
    if ((psVar2->img_x == x) && (psVar2->img_y == y)) {
      if (uVar10 == raw_len) {
LAB_00116dc3:
        if (y != 0) {
          uVar13 = (ulong)uVar7;
          lVar18 = -uVar13;
          uVar29 = 0;
          uVar35 = (ulong)(uVar7 - sVar9);
          if (7 < depth) {
            uVar35 = uVar29;
          }
          uVar40 = 1;
          if (7 < depth) {
            uVar40 = (ulong)uVar1;
            sVar9 = x;
          }
          lVar34 = (long)out_n;
          iVar15 = x - 1;
          uVar10 = (sVar9 - 1) * uVar1;
          uVar23 = (ulong)uVar10;
          iVar37 = (int)uVar40;
          uVar36 = (ulong)uVar1;
          lVar16 = uVar35 - lVar34;
          lVar21 = uVar35 - (long)iVar37;
          uVar14 = 0;
          do {
            pbVar27 = raw + 1;
            bVar5 = *raw;
            if ((ulong)bVar5 < 5) {
              bVar6 = bVar5;
              if (uVar14 == 0) {
                bVar6 = ""[bVar5];
              }
              psVar11 = a->out;
              if (0 < iVar37) {
                uVar24 = 0;
                do {
                  switch(bVar6) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar28 = pbVar27[uVar24];
                    goto LAB_00116f29;
                  case 2:
                  case 4:
                    bVar28 = psVar11[uVar24 + uVar29 + lVar18];
                    break;
                  case 3:
                    bVar28 = psVar11[uVar24 + uVar29 + lVar18] >> 1;
                    break;
                  default:
                    goto switchD_00116f0f_default;
                  }
                  bVar28 = bVar28 + pbVar27[uVar24];
LAB_00116f29:
                  psVar11[uVar24 + uVar29 + uVar35] = bVar28;
switchD_00116f0f_default:
                  uVar24 = uVar24 + 1;
                } while (uVar40 != uVar24);
              }
              local_b8 = (int)uVar14;
              lVar4 = uVar35 + uVar7 * local_b8;
              if (depth == 8) {
                if (uVar1 != out_n) {
                  psVar11[(int)uVar1 + lVar4] = 0xff;
                }
                pbVar27 = pbVar27 + (int)uVar1;
                lVar17 = lVar34;
              }
              else {
                pbVar27 = raw + 2;
                lVar17 = 1;
              }
              psVar25 = psVar11 + lVar17 + lVar4;
              if (uVar1 == out_n || depth < 8) {
                switch(bVar6) {
                case 0:
                  memcpy(psVar25,pbVar27,(long)(int)uVar10);
                  break;
                case 1:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar11[uVar24 + lVar17 + uVar29 + uVar35] =
                           psVar11[uVar24 + lVar17 + uVar29 + lVar21] + pbVar27[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar23 != uVar24);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar11[uVar24 + lVar17 + uVar29 + uVar35] =
                           psVar11[uVar24 + lVar17 + uVar29 + lVar18] + pbVar27[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar23 != uVar24);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar10) {
                    lVar17 = lVar17 + uVar29;
                    uVar24 = 0;
                    do {
                      psVar11[uVar24 + lVar17 + uVar35] =
                           (char)((uint)psVar11[uVar24 + lVar17 + lVar21] +
                                  (uint)psVar11[uVar24 + lVar17 + lVar18] >> 1) + pbVar27[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar23 != uVar24);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar10) {
                    lVar17 = lVar17 + uVar29;
                    uVar24 = 0;
                    do {
                      bVar6 = psVar11[uVar24 + lVar17 + lVar21];
                      bVar28 = psVar11[uVar24 + lVar17 + lVar18];
                      bVar26 = psVar11[uVar24 + (lVar17 - ((long)iVar37 + uVar13))];
                      iVar32 = ((uint)bVar28 + (uint)bVar6) - (uint)bVar26;
                      uVar20 = iVar32 - (uint)bVar6;
                      uVar31 = -uVar20;
                      if (0 < (int)uVar20) {
                        uVar31 = uVar20;
                      }
                      uVar38 = iVar32 - (uint)bVar28;
                      uVar20 = -uVar38;
                      if (0 < (int)uVar38) {
                        uVar20 = uVar38;
                      }
                      uVar33 = iVar32 - (uint)bVar26;
                      uVar38 = -uVar33;
                      if (0 < (int)uVar33) {
                        uVar38 = uVar33;
                      }
                      if (uVar20 <= uVar38) {
                        bVar26 = bVar28;
                      }
                      if (uVar38 < uVar31) {
                        bVar6 = bVar26;
                      }
                      if (uVar20 < uVar31) {
                        bVar6 = bVar26;
                      }
                      psVar11[uVar24 + lVar17 + uVar35] = bVar6 + pbVar27[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar23 != uVar24);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar11[uVar24 + lVar17 + uVar29 + uVar35] =
                           (psVar11[uVar24 + lVar17 + uVar29 + lVar21] >> 1) + pbVar27[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar23 != uVar24);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar10) {
                    uVar24 = 0;
                    do {
                      psVar11[uVar24 + lVar17 + uVar29 + uVar35] =
                           psVar11[uVar24 + lVar17 + uVar29 + lVar21] + pbVar27[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar23 != uVar24);
                  }
                }
                pbVar27 = pbVar27 + (int)uVar10;
              }
              else if (bVar6 < 7) {
                psVar19 = psVar11 + lVar17 + lVar18 + (ulong)(uVar7 * local_b8);
                switch(bVar6) {
                case 0:
                  for (iVar32 = iVar15; iVar32 != 0; iVar32 = iVar32 + -1) {
                    if (0 < (int)uVar1) {
                      uVar24 = 0;
                      do {
                        psVar25[uVar24] = pbVar27[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar36 != uVar24);
                    }
                    psVar25[(int)uVar1] = 0xff;
                    pbVar27 = pbVar27 + (int)uVar1;
                    psVar25 = psVar25 + lVar34;
                  }
                  break;
                case 1:
                  if (iVar15 != 0) {
                    psVar11 = psVar11 + lVar17 + uVar29 + lVar16;
                    iVar32 = iVar15;
                    do {
                      if (0 < (int)uVar1) {
                        uVar24 = 0;
                        do {
                          psVar25[uVar24] = psVar11[uVar24] + pbVar27[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar36 != uVar24);
                      }
                      psVar25[(int)uVar1] = 0xff;
                      pbVar27 = pbVar27 + (int)uVar1;
                      psVar25 = psVar25 + lVar34;
                      psVar11 = psVar11 + lVar34;
                      iVar32 = iVar32 + -1;
                    } while (iVar32 != 0);
                  }
                  break;
                case 2:
                  for (iVar32 = iVar15; iVar32 != 0; iVar32 = iVar32 + -1) {
                    if (0 < (int)uVar1) {
                      uVar24 = 0;
                      do {
                        psVar25[uVar24] = psVar19[uVar24] + pbVar27[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar36 != uVar24);
                    }
                    psVar25[(int)uVar1] = 0xff;
                    pbVar27 = pbVar27 + (int)uVar1;
                    psVar25 = psVar25 + lVar34;
                    psVar19 = psVar19 + lVar34;
                  }
                  break;
                case 3:
                  if (iVar15 != 0) {
                    psVar11 = psVar11 + lVar17 + uVar29 + lVar16;
                    iVar32 = iVar15;
                    do {
                      if (0 < (int)uVar1) {
                        uVar24 = 0;
                        do {
                          psVar25[uVar24] =
                               (char)((uint)psVar11[uVar24] + (uint)psVar19[uVar24] >> 1) +
                               pbVar27[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar36 != uVar24);
                      }
                      psVar25[(int)uVar1] = 0xff;
                      pbVar27 = pbVar27 + (int)uVar1;
                      psVar25 = psVar25 + lVar34;
                      psVar19 = psVar19 + lVar34;
                      psVar11 = psVar11 + lVar34;
                      iVar32 = iVar32 + -1;
                    } while (iVar32 != 0);
                  }
                  break;
                case 4:
                  if (iVar15 != 0) {
                    psVar22 = psVar11 + lVar17 + uVar29 + lVar16;
                    psVar11 = psVar11 + ((lVar17 + uVar29) - (uVar13 + lVar34));
                    iVar32 = iVar15;
                    do {
                      if (0 < (int)uVar1) {
                        uVar24 = 0;
                        do {
                          bVar6 = psVar22[uVar24];
                          bVar28 = psVar19[uVar24];
                          bVar26 = psVar11[uVar24];
                          iVar39 = ((uint)bVar28 + (uint)bVar6) - (uint)bVar26;
                          uVar20 = iVar39 - (uint)bVar6;
                          uVar31 = -uVar20;
                          if (0 < (int)uVar20) {
                            uVar31 = uVar20;
                          }
                          uVar38 = iVar39 - (uint)bVar28;
                          uVar20 = -uVar38;
                          if (0 < (int)uVar38) {
                            uVar20 = uVar38;
                          }
                          uVar33 = iVar39 - (uint)bVar26;
                          uVar38 = -uVar33;
                          if (0 < (int)uVar33) {
                            uVar38 = uVar33;
                          }
                          if (uVar20 <= uVar38) {
                            bVar26 = bVar28;
                          }
                          if (uVar38 < uVar31) {
                            bVar6 = bVar26;
                          }
                          if (uVar20 < uVar31) {
                            bVar6 = bVar26;
                          }
                          psVar25[uVar24] = bVar6 + pbVar27[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar36 != uVar24);
                      }
                      psVar25[(int)uVar1] = 0xff;
                      pbVar27 = pbVar27 + (int)uVar1;
                      psVar25 = psVar25 + lVar34;
                      psVar19 = psVar19 + lVar34;
                      psVar22 = psVar22 + lVar34;
                      psVar11 = psVar11 + lVar34;
                      iVar32 = iVar32 + -1;
                    } while (iVar32 != 0);
                  }
                  break;
                case 5:
                  if (iVar15 != 0) {
                    psVar11 = psVar11 + lVar17 + uVar29 + lVar16;
                    iVar32 = iVar15;
                    do {
                      if (0 < (int)uVar1) {
                        uVar24 = 0;
                        do {
                          psVar25[uVar24] = (psVar11[uVar24] >> 1) + pbVar27[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar36 != uVar24);
                      }
                      psVar25[(int)uVar1] = 0xff;
                      pbVar27 = pbVar27 + (int)uVar1;
                      psVar25 = psVar25 + lVar34;
                      psVar11 = psVar11 + lVar34;
                      iVar32 = iVar32 + -1;
                    } while (iVar32 != 0);
                  }
                  break;
                case 6:
                  if (iVar15 != 0) {
                    psVar11 = psVar11 + lVar17 + uVar29 + lVar16;
                    iVar32 = iVar15;
                    do {
                      if (0 < (int)uVar1) {
                        uVar24 = 0;
                        do {
                          psVar25[uVar24] = psVar11[uVar24] + pbVar27[uVar24];
                          uVar24 = uVar24 + 1;
                        } while (uVar36 != uVar24);
                      }
                      psVar25[(int)uVar1] = 0xff;
                      pbVar27 = pbVar27 + (int)uVar1;
                      psVar25 = psVar25 + lVar34;
                      psVar11 = psVar11 + lVar34;
                      iVar32 = iVar32 + -1;
                    } while (iVar32 != 0);
                  }
                }
              }
            }
            else {
              stbi__g_failure_reason = "invalid filter";
            }
            if (4 < bVar5) {
              return 0;
            }
            uVar14 = uVar14 + 1;
            uVar29 = (ulong)((int)uVar29 + uVar7);
            raw = pbVar27;
          } while (uVar14 != y);
        }
        if (y == 0 || 7 < depth) {
          return 1;
        }
        uVar10 = x - 1;
        lVar16 = uVar7 - uVar12;
        lVar18 = (ulong)uVar10 + 1;
        uVar31 = 0;
        uVar35 = 0;
        do {
          bVar5 = 1;
          if (color == 0) {
            bVar5 = ""[(uint)depth];
          }
          psVar11 = a->out;
          pbVar30 = psVar11 + uVar7 * (int)uVar35;
          pbVar27 = pbVar30 + (uVar7 - uVar12);
          uVar13 = (ulong)uVar31;
          if (depth == 4) {
            iVar15 = iVar8;
            if (1 < iVar8) {
              psVar25 = psVar11 + lVar16;
              iVar37 = iVar8;
              do {
                psVar11[uVar13] = (psVar25[uVar13] >> 4) * bVar5;
                psVar11[uVar13 + 1] = (psVar25[uVar13] & 0xf) * bVar5;
                iVar15 = iVar37 + -2;
                psVar25 = psVar25 + 1;
                psVar11 = psVar11 + 2;
                bVar3 = 3 < iVar37;
                iVar37 = iVar15;
              } while (bVar3);
              pbVar27 = psVar25 + uVar13;
              pbVar30 = psVar11 + uVar13;
            }
            if (iVar15 == 1) {
              bVar6 = *pbVar27 >> 4;
LAB_001177e4:
              bVar5 = bVar6 * bVar5;
LAB_001177e7:
              *pbVar30 = bVar5;
            }
          }
          else if (depth == 2) {
            iVar15 = iVar8;
            if (3 < iVar8) {
              psVar25 = psVar11 + lVar16;
              iVar37 = iVar8;
              do {
                psVar11[uVar13] = (psVar25[uVar13] >> 6) * bVar5;
                psVar11[uVar13 + 1] = (psVar25[uVar13] >> 4 & 3) * bVar5;
                psVar11[uVar13 + 2] = (psVar25[uVar13] >> 2 & 3) * bVar5;
                psVar11[uVar13 + 3] = (psVar25[uVar13] & 3) * bVar5;
                iVar15 = iVar37 + -4;
                psVar25 = psVar25 + 1;
                psVar11 = psVar11 + 4;
                bVar3 = 7 < iVar37;
                iVar37 = iVar15;
              } while (bVar3);
              pbVar27 = psVar25 + uVar13;
              pbVar30 = psVar11 + uVar13;
            }
            if (0 < iVar15) {
              *pbVar30 = (*pbVar27 >> 6) * bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (1 < iVar15) {
              *pbVar30 = (*pbVar27 >> 4 & 3) * bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (iVar15 == 3) {
              bVar6 = *pbVar27 >> 2 & 3;
              goto LAB_001177e4;
            }
          }
          else if (depth == 1) {
            iVar15 = iVar8;
            if (7 < iVar8) {
              psVar25 = psVar11 + lVar16;
              iVar37 = iVar8;
              do {
                psVar11[uVar13] = (char)psVar25[uVar13] >> 7 & bVar5;
                psVar11[uVar13 + 1] = (char)(psVar25[uVar13] * '\x02') >> 7 & bVar5;
                psVar11[uVar13 + 2] = (char)(psVar25[uVar13] << 2) >> 7 & bVar5;
                psVar11[uVar13 + 3] = (char)(psVar25[uVar13] << 3) >> 7 & bVar5;
                psVar11[uVar13 + 4] = (char)(psVar25[uVar13] << 4) >> 7 & bVar5;
                psVar11[uVar13 + 5] = (char)(psVar25[uVar13] << 5) >> 7 & bVar5;
                psVar11[uVar13 + 6] = (char)(psVar25[uVar13] << 6) >> 7 & bVar5;
                bVar6 = bVar5;
                if ((psVar25[uVar13] & 1) == 0) {
                  bVar6 = 0;
                }
                psVar11[uVar13 + 7] = bVar6;
                iVar15 = iVar37 + -8;
                psVar25 = psVar25 + 1;
                psVar11 = psVar11 + 8;
                bVar3 = 0xf < iVar37;
                iVar37 = iVar15;
              } while (bVar3);
              pbVar27 = psVar25 + uVar13;
              pbVar30 = psVar11 + uVar13;
            }
            if (0 < iVar15) {
              *pbVar30 = (char)*pbVar27 >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (1 < iVar15) {
              *pbVar30 = (char)(*pbVar27 * '\x02') >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (2 < iVar15) {
              *pbVar30 = (char)(*pbVar27 << 2) >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (3 < iVar15) {
              *pbVar30 = (char)(*pbVar27 << 3) >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (4 < iVar15) {
              *pbVar30 = (char)(*pbVar27 << 4) >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (5 < iVar15) {
              *pbVar30 = (char)(*pbVar27 << 5) >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (iVar15 == 7) {
              bVar5 = (char)(*pbVar27 << 6) >> 7 & bVar5;
              goto LAB_001177e7;
            }
          }
          if (uVar1 != out_n) {
            psVar11 = a->out;
            if (uVar1 == 1) {
              lVar21 = lVar18;
              if (-1 < (int)uVar10) {
                do {
                  psVar11[lVar21 * 2 + (uVar13 - 1)] = 0xff;
                  psVar11[lVar21 * 2 + (uVar13 - 2)] = psVar11[lVar21 + (uVar13 - 1)];
                  lVar34 = lVar21 + -1;
                  bVar3 = 0 < lVar21;
                  lVar21 = lVar34;
                } while (lVar34 != 0 && bVar3);
              }
            }
            else if (-1 < (int)uVar10) {
              psVar25 = psVar11 + (ulong)uVar10 * 3 + 2 + uVar13;
              lVar21 = lVar18;
              do {
                psVar11[lVar21 * 4 + (uVar13 - 1)] = 0xff;
                psVar11[lVar21 * 4 + (uVar13 - 2)] = *psVar25;
                psVar11[lVar21 * 4 + (uVar13 - 3)] = psVar25[-1];
                psVar11[lVar21 * 4 + (uVar13 - 4)] = psVar25[-2];
                psVar25 = psVar25 + -3;
                lVar34 = lVar21 + -1;
                bVar3 = 0 < lVar21;
                lVar21 = lVar34;
              } while (lVar34 != 0 && bVar3);
            }
          }
          uVar35 = uVar35 + 1;
          uVar31 = uVar31 + uVar7;
          if (uVar35 == y) {
            return 1;
          }
        } while( true );
      }
    }
    else if (uVar10 <= raw_len) goto LAB_00116dc3;
    stbi__g_failure_reason = "not enough pixels";
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}